

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,string_view value)

{
  cmVariableWatch *this_00;
  const_pointer newValue;
  cmVariableWatch *vv;
  string *name_local;
  cmMakefile *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (cmMakefile *)value._M_len;
  cmStateSnapshot::SetDefinition(&this->StateSnapshot,name,value);
  this_00 = GetVariableWatch(this);
  if (this_00 != (cmVariableWatch *)0x0) {
    newValue = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    cmVariableWatch::VariableAccessed(this_00,name,3,newValue,this);
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, cm::string_view value)
{
  this->StateSnapshot.SetDefinition(name, value);

#ifndef CMAKE_BOOTSTRAP
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value.data(), this);
  }
#endif
}